

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

void __thiscall kj::anon_unknown_77::AsyncTee::~AsyncTee(AsyncTee *this)

{
  uint uVar1;
  PromiseNode *pPVar2;
  Disposer *pDVar3;
  AsyncInputStream *pAVar4;
  long lVar5;
  Fault f;
  Fault local_28;
  
  if ((this->branches[0].ptr.isSet != false) || (this->branches[1].ptr.isSet == true)) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[44]>
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
               ,0x4ba,FAILED,"!hasBranches","\"destroying AsyncTee with branch still alive\"",
               (char (*) [44])"destroying AsyncTee with branch still alive");
    kj::_::Debug::Fault::~Fault(&local_28);
  }
  pPVar2 = (this->pullPromise).super_PromiseBase.node.ptr;
  if (pPVar2 != (PromiseNode *)0x0) {
    (this->pullPromise).super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    pDVar3 = (this->pullPromise).super_PromiseBase.node.disposer;
    (**pDVar3->_vptr_Disposer)
              (pDVar3,pPVar2->_vptr_PromiseNode[-2] + (long)&pPVar2->_vptr_PromiseNode);
  }
  if ((this->stoppage).ptr.isSet == true) {
    uVar1 = (this->stoppage).ptr.field_1.value.tag;
    if (uVar1 == 2) {
      (this->stoppage).ptr.field_1.value.tag = 0;
      Exception::~Exception((Exception *)&(this->stoppage).ptr.field_1.value.field_1);
    }
    else if (uVar1 == 1) {
      (this->stoppage).ptr.field_1.value.tag = 0;
    }
  }
  lVar5 = 0;
  do {
    if ((&this->branches[1].ptr.isSet)[lVar5] == true) {
      std::deque<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>::~deque
                ((deque<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_> *)
                 ((long)&this->branches[1].ptr.field_1 + lVar5));
    }
    lVar5 = lVar5 + -0x60;
  } while (lVar5 != -0xc0);
  pAVar4 = (this->inner).ptr;
  if (pAVar4 != (AsyncInputStream *)0x0) {
    (this->inner).ptr = (AsyncInputStream *)0x0;
    pDVar3 = (this->inner).disposer;
    (**pDVar3->_vptr_Disposer)
              (pDVar3,pAVar4->_vptr_AsyncInputStream[-2] + (long)&pAVar4->_vptr_AsyncInputStream);
  }
  Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

~AsyncTee() noexcept(false) {
    bool hasBranches = false;
    for (auto& branch: branches) {
      hasBranches = hasBranches || branch != nullptr;
    }
    KJ_ASSERT(!hasBranches, "destroying AsyncTee with branch still alive") {
      // Don't std::terminate().
      break;
    }
  }